

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dofhandler.cc
# Opt level: O3

span<const_long,_18446744073709551615UL> __thiscall
lf::assemble::UniformFEDofHandler::InteriorGlobalDofIndices
          (UniformFEDofHandler *this,RefEl ref_el_type,glb_idx_t entity_index)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  dim_t dVar4;
  size_type sVar5;
  size_type sVar6;
  uint uVar7;
  ostream *poVar8;
  uint uVar9;
  span<const_long,_18446744073709551615UL> sVar10;
  stringstream ss;
  string local_210;
  string local_1f0;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  dVar4 = base::internal::DimensionImpl(ref_el_type.type_);
  uVar9 = 2 - dVar4;
  sVar5 = NumCoveredDofs(this,ref_el_type);
  sVar6 = NumInteriorDofs(this,ref_el_type);
  peVar3 = (this->mesh_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  uVar7 = (*peVar3->_vptr_Mesh[3])(peVar3,(ulong)uVar9);
  if (entity_index < uVar7) {
    sVar10._M_extent._M_extent_value = (ulong)sVar5 - (ulong)(sVar5 - sVar6);
    sVar10._M_ptr =
         (this->dofs_)._M_elems[uVar9].super__Vector_base<long,_std::allocator<long>_>._M_impl.
         super__Vector_impl_data._M_start +
         (ulong)entity_index * (ulong)(this->num_dofs_)._M_elems[uVar9] + (ulong)(sVar5 - sVar6);
    return sVar10;
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Index ",6);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," out of range",0xd);
  paVar1 = &local_1f0.field_2;
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,"(mesh_->NumEntities(codim) > entity_index)","");
  paVar2 = &local_210.field_2;
  local_210._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_210,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.cc"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_1f0,&local_210,0x13b,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != paVar2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  local_1f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"false","");
  local_210._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_210,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.cc"
             ,"");
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
  base::AssertionFailed(&local_1f0,&local_210,0x13b,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  abort();
}

Assistant:

std::span<const gdof_idx_t> UniformFEDofHandler::InteriorGlobalDofIndices(
    lf::base::RefEl ref_el_type, glb_idx_t entity_index) const {
  // Co-dimension of entity in a 2D mesh
  const dim_t codim = 2 - ref_el_type.Dimension();
  const size_type no_covered_dofs = NumCoveredDofs(ref_el_type);
  const size_type no_loc_dofs = NumInteriorDofs(ref_el_type);

  LF_ASSERT_MSG((mesh_->NumEntities(codim) > entity_index),
                "Index " << entity_index << " out of range");
  // Pointers to range of dof indices
  const gdof_idx_t *begin =
      dofs_[codim].data() +
      (static_cast<std::size_t>(num_dofs_[codim]) * entity_index);
  const gdof_idx_t *end = begin + no_covered_dofs;
  begin += (no_covered_dofs - no_loc_dofs);
  return {begin, end};
}